

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O1

int main(void)

{
  GLFWwindow *pGVar1;
  GLFWwindow *pGVar2;
  int iVar3;
  int iVar4;
  GLFWwindow *handle;
  float *pfVar5;
  int joy;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  GLint GVar10;
  int iVar11;
  GLfloat GVar12;
  int height;
  int width;
  int button_count;
  int axis_count;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  uchar *local_68;
  int local_60;
  int local_5c;
  int local_58;
  float local_54;
  ulong local_50;
  long local_48;
  GLFWwindow *local_40;
  float *local_38;
  
  joysticks[0xc] = 0;
  joysticks[0xd] = 0;
  joysticks[0xe] = 0;
  joysticks[0xf] = 0;
  joysticks[8] = 0;
  joysticks[9] = 0;
  joysticks[10] = 0;
  joysticks[0xb] = 0;
  joysticks[4] = 0;
  joysticks[5] = 0;
  joysticks[6] = 0;
  joysticks[7] = 0;
  joysticks[0] = 0;
  joysticks[1] = 0;
  joysticks[2] = 0;
  joysticks[3] = 0;
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 != 0) {
    iVar3 = 0;
    do {
      iVar4 = glfwJoystickPresent(iVar3);
      if (iVar4 != 0) {
        joystick_callback(iVar3,0x40001);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x10);
    glfwSetJoystickCallback(joystick_callback);
    handle = glfwCreateWindow(0x280,0x1e0,"Joystick Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(1);
      iVar3 = glfwWindowShouldClose(handle);
      pGVar2 = handle;
      pGVar1 = local_40;
      while (local_40 = pGVar2, iVar3 == 0) {
        (*glad_glClear)(0x4000);
        glfwGetFramebufferSize(handle,&local_74,&local_78);
        (*glad_glMatrixMode)(0x1701);
        (*glad_glLoadIdentity)();
        (*glad_glOrtho)(0.0,(double)local_74,(double)local_78,0.0,1.0,-1.0);
        (*glad_glMatrixMode)(0x1700);
        uVar8 = (ulong)(uint)joystick_count;
        if (0 < joystick_count) {
          lVar9 = 0;
          do {
            iVar4 = local_74;
            iVar11 = (local_78 * (int)lVar9) / (int)uVar8;
            iVar3 = local_78 / (int)uVar8;
            iVar6 = iVar3 * 3 + 3;
            if (-1 < iVar3 * 3) {
              iVar6 = iVar3 * 3;
            }
            local_50 = (ulong)(uint)(iVar6 >> 2);
            local_60 = iVar3 + 3;
            if (-1 < iVar3) {
              local_60 = iVar3;
            }
            local_48 = lVar9;
            pfVar5 = glfwGetJoystickAxes(joysticks[lVar9],&local_6c);
            if ((local_6c != 0) && (iVar3 = iVar4 / local_6c, 0 < local_6c)) {
              local_54 = (float)((int)local_50 + -5);
              local_58 = (int)local_50 + iVar11;
              local_5c = iVar11 + 5;
              lVar9 = 0;
              GVar10 = 0;
              local_38 = pfVar5;
              do {
                local_68 = (uchar *)CONCAT44(local_68._4_4_,(local_38[lVar9] * 0.5 + 0.5) * local_54
                                            );
                (*glad_glColor3f)(0.3,0.3,0.3);
                lVar9 = lVar9 + 1;
                iVar6 = iVar3 + GVar10;
                (*glad_glRecti)(GVar10,iVar11,iVar6,local_58);
                (*glad_glColor3f)(1.0,1.0,1.0);
                (*glad_glRecti)(GVar10,iVar11 + (int)local_68._0_4_,iVar6,
                                (int)local_68._0_4_ + local_5c);
                GVar10 = iVar6;
              } while (lVar9 < local_6c);
            }
            local_68 = glfwGetJoystickButtons(joysticks[local_48],&local_70);
            if ((local_70 != 0) && (iVar4 = iVar4 / local_70, 0 < local_70)) {
              iVar6 = local_60 >> 2;
              iVar11 = (int)local_50 + iVar11;
              lVar9 = 0;
              iVar3 = 0;
              do {
                if (local_68[lVar9] == '\0') {
                  GVar12 = 0.3;
                }
                else {
                  GVar12 = 1.0;
                }
                (*glad_glColor3f)(GVar12,GVar12,GVar12);
                lVar9 = lVar9 + 1;
                iVar7 = iVar4 + iVar3;
                (*glad_glRecti)(iVar3,iVar11,iVar7,iVar6 + iVar11);
                iVar3 = iVar7;
              } while (lVar9 < local_70);
            }
            lVar9 = local_48 + 1;
            uVar8 = (ulong)joystick_count;
          } while (lVar9 < (long)uVar8);
        }
        handle = local_40;
        glfwSwapBuffers(local_40);
        glfwPollEvents();
        fflush(_stdout);
        iVar3 = glfwWindowShouldClose(handle);
        pGVar2 = local_40;
        pGVar1 = local_40;
      }
      local_40 = pGVar1;
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    memset(joysticks, 0, sizeof(joysticks));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    find_joysticks();
    glfwSetJoystickCallback(joystick_callback);

    window = glfwCreateWindow(640, 480, "Joystick Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        draw_joysticks(window);

        glfwSwapBuffers(window);
        glfwPollEvents();

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}